

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation
          (ConflictPoolPropagation *this,ConflictPoolPropagation *other)

{
  undefined4 *in_RSI;
  vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  *in_RDI;
  vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  *unaff_retaddr;
  ConflictPoolPropagation *in_stack_ffffffffffffffa8;
  HighsConflictPool *this_00;
  vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  *__x;
  
  *(undefined4 *)
   &(in_RDI->
    super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
    )._M_impl.super__Vector_impl_data._M_start = *in_RSI;
  (in_RDI->
  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  )._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(in_RSI + 2);
  (in_RDI->
  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_RSI + 4);
  __x = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)__x);
  this_00 = (HighsConflictPool *)(in_RDI + 5);
  std::
  vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  ::vector(unaff_retaddr,__x);
  HighsConflictPool::addPropagationDomain(this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation(
    const ConflictPoolPropagation& other)
    : conflictpoolindex(other.conflictpoolindex),
      domain(other.domain),
      conflictpool_(other.conflictpool_),
      colLowerWatched_(other.colLowerWatched_),
      colUpperWatched_(other.colUpperWatched_),
      conflictFlag_(other.conflictFlag_),
      propagateConflictInds_(other.propagateConflictInds_),
      watchedLiterals_(other.watchedLiterals_) {
  conflictpool_->addPropagationDomain(this);
}